

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_cast.hpp
# Opt level: O2

Sentinel __thiscall
chaiscript::boxed_cast<std::shared_ptr<TestBaseType>&>
          (chaiscript *this,Boxed_Value *bv,Type_Conversions_State *t_conversions)

{
  element_type *peVar1;
  type_info *ptVar2;
  type_info *ptVar3;
  bool bVar4;
  shared_ptr<TestBaseType> *psVar5;
  undefined8 *puVar6;
  Data *extraout_RDX;
  Sentinel SVar8;
  undefined1 local_38 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  reference_wrapper<chaiscript::Boxed_Value::Data> rVar7;
  
  if (t_conversions != (Type_Conversions_State *)0x0) {
    local_38 = (undefined1  [8])&std::shared_ptr<TestBaseType>::typeinfo;
    a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&TestBaseType::typeinfo;
    a_Stack_30[1]._M_pi = a_Stack_30[1]._M_pi & 0xffffffff00000000;
    bVar4 = Type_Info::bare_equal
                      (&((bv->m_data).
                         super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->m_type_info,(Type_Info *)local_38);
    if (!bVar4) {
      bVar4 = Type_Conversions::convertable_type<std::shared_ptr<TestBaseType>&>
                        ((t_conversions->m_conversions)._M_data);
      if (bVar4) {
        bVar4 = Type_Conversions::convertable_type<std::shared_ptr<TestBaseType>&>
                          ((t_conversions->m_conversions)._M_data);
        if (!bVar4) {
          puVar6 = (undefined8 *)__cxa_allocate_exception(0x38);
          peVar1 = (bv->m_data).
                   super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          a_Stack_30[1]._M_pi._0_4_ = (peVar1->m_type_info).m_flags;
          a_Stack_30[1]._M_pi._4_4_ = *(undefined4 *)&(peVar1->m_type_info).field_0x14;
          ptVar2 = (peVar1->m_type_info).m_type_info;
          ptVar3 = (peVar1->m_type_info).m_bare_type_info;
          *puVar6 = &PTR__bad_cast_001aab00;
          local_38._0_4_ = SUB84(ptVar2,0);
          local_38._4_4_ = (undefined4)((ulong)ptVar2 >> 0x20);
          a_Stack_30[0]._M_pi._0_4_ = SUB84(ptVar3,0);
          a_Stack_30[0]._M_pi._4_4_ = (undefined4)((ulong)ptVar3 >> 0x20);
          *(undefined4 *)(puVar6 + 1) = local_38._0_4_;
          *(undefined4 *)((long)puVar6 + 0xc) = local_38._4_4_;
          *(undefined4 *)(puVar6 + 2) = a_Stack_30[0]._M_pi._0_4_;
          *(undefined4 *)((long)puVar6 + 0x14) = a_Stack_30[0]._M_pi._4_4_;
          puVar6[3] = a_Stack_30[1]._M_pi;
          puVar6[4] = &std::shared_ptr<TestBaseType>::typeinfo;
          puVar6[5] = 0x19;
          puVar6[6] = "Cannot perform boxed_cast";
          local_38 = (undefined1  [8])ptVar2;
          a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ptVar3;
          __cxa_throw(puVar6,&exception::bad_boxed_cast::typeinfo,std::bad_cast::~bad_cast);
        }
        Type_Conversions::boxed_type_conversion<std::shared_ptr<TestBaseType>&>
                  ((Type_Conversions *)local_38,
                   (Conversion_Saves *)(t_conversions->m_conversions)._M_data,
                   (Boxed_Value *)(t_conversions->m_saves)._M_data);
        psVar5 = detail::Any::cast<std::shared_ptr<TestBaseType>>((Any *)((long)local_38 + 0x18));
        *(shared_ptr<TestBaseType> **)this = psVar5;
        *(undefined1 (*) [8])(this + 8) = local_38;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
        rVar7._M_data = extraout_RDX;
        goto LAB_0018da95;
      }
    }
  }
  SVar8 = detail::Cast_Helper_Inner<std::shared_ptr<TestBaseType>_&>::cast
                    ((Boxed_Value *)this,(Type_Conversions_State *)bv);
  rVar7 = SVar8.m_data._M_data;
LAB_0018da95:
  SVar8.m_data._M_data = rVar7._M_data;
  SVar8.m_ptr._M_data = (shared_ptr<TestBaseType> *)this;
  return SVar8;
}

Assistant:

decltype(auto) boxed_cast(const Boxed_Value &bv, const Type_Conversions_State *t_conversions = nullptr) {
    if (!t_conversions || bv.get_type_info().bare_equal(user_type<Type>()) || (t_conversions && !(*t_conversions)->convertable_type<Type>())) {
      try {
        return detail::Cast_Helper<Type>::cast(bv, t_conversions);
      } catch (const chaiscript::detail::exception::bad_any_cast &) {
      }
    }

    if (t_conversions && (*t_conversions)->convertable_type<Type>()) {
      try {
        // We will not catch any bad_boxed_dynamic_cast that is thrown, let the user get it
        // either way, we are not responsible if it doesn't work
        return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_conversion<Type>(t_conversions->saves(), bv), t_conversions));
      } catch (...) {
        try {
          // try going the other way
          return (detail::Cast_Helper<Type>::cast((*t_conversions)->boxed_type_down_conversion<Type>(t_conversions->saves(), bv),
                                                  t_conversions));
        } catch (const chaiscript::detail::exception::bad_any_cast &) {
          throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
        }
      }
    } else {
      // If it's not convertable, just throw the error, don't waste the time on the
      // attempted dynamic_cast
      throw exception::bad_boxed_cast(bv.get_type_info(), typeid(Type));
    }
  }